

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O0

void __thiscall
jaegertracing::thrift::BaggageRestrictionManagerClient::recv_getBaggageRestrictions
          (BaggageRestrictionManagerClient *this,
          vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
          *_return)

{
  int iVar1;
  element_type *peVar2;
  TApplicationException *pTVar3;
  int32_t *seqid;
  void *__buf;
  void *__buf_00;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [24];
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  TApplicationException x;
  TMessageType local_44;
  undefined1 local_40 [4];
  TMessageType mtype;
  string fname;
  int32_t rseqid;
  vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
  *_return_local;
  BaggageRestrictionManagerClient *this_local;
  
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_40);
  seqid = (int32_t *)(fname.field_2._M_local_buf + 0xc);
  apache::thrift::protocol::TProtocol::readMessageBegin
            (this->iprot_,(string *)local_40,&local_44,seqid);
  if (local_44 == T_EXCEPTION) {
    apache::thrift::TApplicationException::TApplicationException
              ((TApplicationException *)(local_98 + 0x10));
    apache::thrift::TApplicationException::read
              ((TApplicationException *)(local_98 + 0x10),(int)this->iprot_,__buf,(size_t)seqid);
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_98);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_98);
    (*peVar2->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_98);
    pTVar3 = (TApplicationException *)__cxa_allocate_exception(0x30);
    apache::thrift::TApplicationException::TApplicationException
              (pTVar3,(TApplicationException *)(local_98 + 0x10));
    __cxa_throw(pTVar3,&apache::thrift::TApplicationException::typeinfo,
                apache::thrift::TApplicationException::~TApplicationException);
  }
  if (local_44 != T_REPLY) {
    apache::thrift::protocol::TProtocol::skip(this->iprot_,T_STRUCT);
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_a8);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    (*peVar2->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_a8);
  }
  iVar1 = std::__cxx11::string::compare(local_40);
  if (iVar1 != 0) {
    apache::thrift::protocol::TProtocol::skip(this->iprot_,T_STRUCT);
    apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)&result.__isset);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&result.__isset);
    (*peVar2->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)&result.__isset);
  }
  BaggageRestrictionManager_getBaggageRestrictions_presult::
  BaggageRestrictionManager_getBaggageRestrictions_presult
            ((BaggageRestrictionManager_getBaggageRestrictions_presult *)(local_e0 + 0x10));
  result._vptr_BaggageRestrictionManager_getBaggageRestrictions_presult = (_func_int **)_return;
  BaggageRestrictionManager_getBaggageRestrictions_presult::read
            ((BaggageRestrictionManager_getBaggageRestrictions_presult *)(local_e0 + 0x10),
             (int)this->iprot_,__buf_00,(size_t)_return);
  apache::thrift::protocol::TProtocol::readMessageEnd(this->iprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_e0);
  peVar2 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e0);
  (*peVar2->_vptr_TTransport[8])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_e0);
  if (((byte)result.success & 1) != 0) {
    BaggageRestrictionManager_getBaggageRestrictions_presult::
    ~BaggageRestrictionManager_getBaggageRestrictions_presult
              ((BaggageRestrictionManager_getBaggageRestrictions_presult *)(local_e0 + 0x10));
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  pTVar3 = (TApplicationException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"getBaggageRestrictions failed: unknown result",&local_101);
  apache::thrift::TApplicationException::TApplicationException(pTVar3,MISSING_RESULT,&local_100);
  __cxa_throw(pTVar3,&apache::thrift::TApplicationException::typeinfo,
              apache::thrift::TApplicationException::~TApplicationException);
}

Assistant:

void BaggageRestrictionManagerClient::recv_getBaggageRestrictions(std::vector<BaggageRestriction> & _return)
{

  int32_t rseqid = 0;
  std::string fname;
  ::apache::thrift::protocol::TMessageType mtype;

  iprot_->readMessageBegin(fname, mtype, rseqid);
  if (mtype == ::apache::thrift::protocol::T_EXCEPTION) {
    ::apache::thrift::TApplicationException x;
    x.read(iprot_);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
    throw x;
  }
  if (mtype != ::apache::thrift::protocol::T_REPLY) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  if (fname.compare("getBaggageRestrictions") != 0) {
    iprot_->skip(::apache::thrift::protocol::T_STRUCT);
    iprot_->readMessageEnd();
    iprot_->getTransport()->readEnd();
  }
  BaggageRestrictionManager_getBaggageRestrictions_presult result;
  result.success = &_return;
  result.read(iprot_);
  iprot_->readMessageEnd();
  iprot_->getTransport()->readEnd();

  if (result.__isset.success) {
    // _return pointer has now been filled
    return;
  }
  throw ::apache::thrift::TApplicationException(::apache::thrift::TApplicationException::MISSING_RESULT, "getBaggageRestrictions failed: unknown result");
}